

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_encoder.hpp
# Opt level: O2

bool __thiscall
jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
visit_begin_object(basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
                  size_t length,semantic_tag param_2,ser_context *param_3,error_code *ec)

{
  int iVar1;
  binary_stream_sink *d_first;
  byte val;
  size_t length_local;
  cbor_container_type local_14;
  
  iVar1 = this->nesting_depth_;
  this->nesting_depth_ = iVar1 + 1;
  length_local = length;
  if (iVar1 < *(int *)((this->options_)._vptr_cbor_encode_options[-3] + 8 +
                      (long)&(this->options_)._vptr_cbor_encode_options)) {
    local_14 = object;
    std::
    vector<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,std::allocator<char>>::stack_item,std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,std::allocator<char>>::stack_item>>
    ::emplace_back<jsoncons::cbor::cbor_container_type,unsigned_long&>
              ((vector<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,std::allocator<char>>::stack_item,std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,std::allocator<char>>::stack_item>>
                *)&this->stack_,&local_14,&length_local);
    if (length_local < 0x18) {
      val = (byte)length_local | 0xa0;
    }
    else {
      if (0xff < length_local) {
        if (length_local < 0x10000) {
          binary::
          native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                    (0xb9,(back_insert_iterator<jsoncons::binary_stream_sink>)&this->sink_);
          binary::
          native_to_big<unsigned_short,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                    ((unsigned_short)length_local,
                     (back_insert_iterator<jsoncons::binary_stream_sink>)&this->sink_);
          return true;
        }
        d_first = &this->sink_;
        if (length_local >> 0x20 == 0) {
          binary::
          native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                    (0xba,(back_insert_iterator<jsoncons::binary_stream_sink>)d_first);
          binary::
          native_to_big<unsigned_int,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                    ((uint)length_local,(back_insert_iterator<jsoncons::binary_stream_sink>)d_first)
          ;
          return true;
        }
        binary::
        native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                  (0xbb,(back_insert_iterator<jsoncons::binary_stream_sink>)d_first);
        binary::
        native_to_big<unsigned_long,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                  (length_local,(back_insert_iterator<jsoncons::binary_stream_sink>)d_first);
        return true;
      }
      binary::
      native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                (0xb8,(back_insert_iterator<jsoncons::binary_stream_sink>)&this->sink_);
      val = (byte)length_local;
    }
    binary::
    native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
              (val,(back_insert_iterator<jsoncons::binary_stream_sink>)&this->sink_);
  }
  else {
    std::error_code::operator=(ec,max_nesting_depth_exceeded);
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_begin_object(std::size_t length, semantic_tag, const ser_context&, std::error_code& ec) override
    {
        if (JSONCONS_UNLIKELY(++nesting_depth_ > options_.max_nesting_depth()))
        {
            ec = cbor_errc::max_nesting_depth_exceeded;
            JSONCONS_VISITOR_RETURN;
        } 
        stack_.emplace_back(cbor_container_type::object, length);

        if (length <= 0x17)
        {
            binary::native_to_big(static_cast<uint8_t>(0xa0 + length), 
                                  std::back_inserter(sink_));
        } 
        else if (length <= 0xff)
        {
            binary::native_to_big(static_cast<uint8_t>(0xb8), 
                                  std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint8_t>(length), 
                                  std::back_inserter(sink_));
        } 
        else if (length <= 0xffff)
        {
            binary::native_to_big(static_cast<uint8_t>(0xb9), 
                                  std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint16_t>(length), 
                                  std::back_inserter(sink_));
        } 
        else if (length <= 0xffffffff)
        {
            binary::native_to_big(static_cast<uint8_t>(0xba), 
                                  std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint32_t>(length), 
                                  std::back_inserter(sink_));
        } 
        else if (uint64_t(length) <= (std::numeric_limits<std::uint64_t>::max)())
        {
            binary::native_to_big(static_cast<uint8_t>(0xbb), 
                                  std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint64_t>(length), 
                                  std::back_inserter(sink_));
        }

        JSONCONS_VISITOR_RETURN;
    }